

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::ContextArrayPack::render
          (ContextArrayPack *this,Primitive primitive,int firstVertex,int vertexCount,bool useVao,
          float coordScale,float colorScale)

{
  Context *pCVar1;
  uint uVar2;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  pointer ppCVar6;
  undefined7 in_register_00000081;
  long lVar7;
  deUint32 vaoId;
  stringstream attribName;
  uint local_1ec;
  long *local_1e8;
  long local_1d8 [2];
  Primitive local_1c8;
  uint local_1c4;
  int local_1c0;
  float local_1bc;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1ec = 0;
  local_1c8 = primitive;
  local_1c4 = firstVertex;
  local_1c0 = vertexCount;
  local_1bc = coordScale;
  updateProgram(this);
  (*this->m_ctx->_vptr_Context[5])
            (this->m_ctx,0,0,(ulong)(uint)(this->m_screen).m_width,
             (ulong)(uint)(this->m_screen).m_height);
  (*this->m_ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*this->m_ctx->_vptr_Context[0x2d])(this->m_ctx,0x4000);
  uVar2 = (*this->m_ctx->_vptr_Context[0x75])(this->m_ctx,this->m_program);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,(ulong)uVar2);
  dVar3 = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(dVar3,"glUseProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                  ,0x48a);
  pCVar1 = this->m_ctx;
  uVar4 = (*pCVar1->_vptr_Context[0x66])(pCVar1,(ulong)uVar2,"u_coordScale");
  (*pCVar1->_vptr_Context[0x5a])(local_1bc,pCVar1,(ulong)uVar4);
  pCVar1 = this->m_ctx;
  uVar4 = (*pCVar1->_vptr_Context[0x66])(pCVar1,(ulong)uVar2,"u_colorScale");
  (*pCVar1->_vptr_Context[0x5a])(colorScale,pCVar1,(ulong)uVar4);
  if ((int)CONCAT71(in_register_00000081,useVao) != 0) {
    (*this->m_ctx->_vptr_Context[0x4c])(this->m_ctx,1,&local_1ec);
    (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,(ulong)local_1ec);
  }
  ppCVar6 = (this->m_arrays).
            super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_arrays).
                              super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6) >> 3)) {
    lVar7 = 0;
    do {
      iVar5 = (*(ppCVar6[lVar7]->super_Array)._vptr_Array[6])();
      if ((char)iVar5 != '\0') {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"a_",2);
        iVar5 = (*((this->m_arrays).
                   super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar7]->super_Array)._vptr_Array[0xe])
                          ();
        std::ostream::operator<<((ostream *)local_1a8,iVar5);
        pCVar1 = this->m_ctx;
        std::__cxx11::stringbuf::str();
        uVar4 = (*pCVar1->_vptr_Context[0x59])(pCVar1,(ulong)uVar2,local_1e8);
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8,local_1d8[0] + 1);
        }
        (*this->m_ctx->_vptr_Context[0x50])(this->m_ctx,(ulong)uVar4);
        dVar3 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar3,"glEnableVertexAttribArray()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                        ,0x49e);
        ContextArray::glBind
                  ((this->m_arrays).
                   super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar7],uVar4);
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      lVar7 = lVar7 + 1;
      ppCVar6 = (this->m_arrays).
                super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar7 < (int)((ulong)((long)(this->m_arrays).
                                         super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6)
                          >> 3));
  }
  (*this->m_ctx->_vptr_Context[0x68])
            (this->m_ctx,(ulong)ContextArray::primitiveToGL::primitives[(int)local_1c8],
             (ulong)local_1c4,(ulong)(local_1c0 - local_1c4));
  dVar3 = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(dVar3,"glDrawArrays()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                  ,0x4a6);
  ppCVar6 = (this->m_arrays).
            super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_arrays).
                              super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6) >> 3)) {
    lVar7 = 0;
    do {
      iVar5 = (*(ppCVar6[lVar7]->super_Array)._vptr_Array[6])();
      if ((char)iVar5 != '\0') {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"a_",2);
        iVar5 = (*((this->m_arrays).
                   super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar7]->super_Array)._vptr_Array[0xe])
                          ();
        std::ostream::operator<<((ostream *)local_1a8,iVar5);
        pCVar1 = this->m_ctx;
        std::__cxx11::stringbuf::str();
        uVar4 = (*pCVar1->_vptr_Context[0x59])(pCVar1,(ulong)uVar2,local_1e8);
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8,local_1d8[0] + 1);
        }
        (*this->m_ctx->_vptr_Context[0x51])(this->m_ctx,(ulong)uVar4);
        dVar3 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar3,"glDisableVertexAttribArray()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                        ,0x4b2);
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      lVar7 = lVar7 + 1;
      ppCVar6 = (this->m_arrays).
                super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar7 < (int)((ulong)((long)(this->m_arrays).
                                         super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6)
                          >> 3));
  }
  if (useVao) {
    (*this->m_ctx->_vptr_Context[0x4d])(this->m_ctx,1,&local_1ec);
  }
  (*this->m_ctx->_vptr_Context[0x77])(this->m_ctx,(ulong)uVar2);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,0);
  (*this->m_ctx->_vptr_Context[0x80])
            (this->m_ctx,&this->m_screen,0,0,(ulong)(uint)(this->m_screen).m_width,
             (ulong)(uint)(this->m_screen).m_height);
  return;
}

Assistant:

void ContextArrayPack::render (Array::Primitive primitive, int firstVertex, int vertexCount, bool useVao, float coordScale, float colorScale)
{
	deUint32 program = 0;
	deUint32 vaoId = 0;

	updateProgram();

	m_ctx.viewport(0, 0, m_screen.getWidth(), m_screen.getHeight());
	m_ctx.clearColor(0.0, 0.0, 0.0, 1.0);
	m_ctx.clear(GL_COLOR_BUFFER_BIT);

	program = m_ctx.createProgram(m_program);

	m_ctx.useProgram(program);
	GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glUseProgram()");

	m_ctx.uniform1f(m_ctx.getUniformLocation(program, "u_coordScale"), coordScale);
	m_ctx.uniform1f(m_ctx.getUniformLocation(program, "u_colorScale"), colorScale);

	if (useVao)
	{
		m_ctx.genVertexArrays(1, &vaoId);
		m_ctx.bindVertexArray(vaoId);
	}

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		if (m_arrays[arrayNdx]->isBound())
		{
			std::stringstream attribName;
			attribName << "a_" << m_arrays[arrayNdx]->getAttribNdx();

			deUint32 loc = m_ctx.getAttribLocation(program, attribName.str().c_str());
			m_ctx.enableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glEnableVertexAttribArray()");

			m_arrays[arrayNdx]->glBind(loc);
		}
	}

	DE_ASSERT((firstVertex % 6) == 0);
	m_ctx.drawArrays(ContextArray::primitiveToGL(primitive), firstVertex, vertexCount - firstVertex);
	GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArrays()");

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		if (m_arrays[arrayNdx]->isBound())
		{
			std::stringstream attribName;
			attribName << "a_" << m_arrays[arrayNdx]->getAttribNdx();

			deUint32 loc = m_ctx.getAttribLocation(program, attribName.str().c_str());

			m_ctx.disableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDisableVertexAttribArray()");
		}
	}

	if (useVao)
		m_ctx.deleteVertexArrays(1, &vaoId);

	m_ctx.deleteProgram(program);
	m_ctx.useProgram(0);
	m_ctx.readPixels(m_screen, 0, 0, m_screen.getWidth(), m_screen.getHeight());
}